

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::fill<kj::String,kj::StringPtr&,kj::String>
                 (char *target,String *first,StringPtr *rest,String *rest_1)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar1 = (first->content).ptr;
  sVar2 = (first->content).size_;
  pcVar3 = pcVar1 + (sVar2 - 1);
  if (sVar2 == 0) {
    pcVar3 = (char *)0x0;
    pcVar1 = (char *)0x0;
  }
  if (pcVar1 != pcVar3) {
    memcpy(target,pcVar1,(long)pcVar3 - (long)pcVar1);
    target = target + ((long)pcVar3 - (long)pcVar1);
  }
  pcVar3 = (rest->content).ptr;
  sVar2 = (rest->content).size_;
  if (pcVar3 != pcVar3 + (sVar2 - 1)) {
    memcpy(target,pcVar3,sVar2 - 1);
    target = target + (sVar2 - 1);
  }
  pcVar1 = (rest_1->content).ptr;
  sVar2 = (rest_1->content).size_;
  pcVar3 = pcVar1 + (sVar2 - 1);
  if (sVar2 == 0) {
    pcVar3 = (char *)0x0;
    pcVar1 = (char *)0x0;
  }
  if (pcVar1 != pcVar3) {
    memcpy(target,pcVar1,(long)pcVar3 - (long)pcVar1);
    target = target + ((long)pcVar3 - (long)pcVar1);
  }
  return target;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}